

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::
     generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool allowMatrixCases,int expandLevel)

{
  Variable *this;
  ResourceTestCase *this_00;
  long lVar1;
  SharedPtr variable;
  ProgramResourceQueryTestTarget local_38;
  
  for (lVar1 = 0; lVar1 != 0xfc; lVar1 = lVar1 + 0xc) {
    if (((allowMatrixCases) ||
        ((&generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
           ::variableTypes[0].isMatrix)[lVar1] == false)) &&
       (*(int *)((long)&generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                        ::variableTypes[0].level + lVar1) <= expandLevel)) {
      this = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable
                (this,parentStructure,
                 *(DataType *)
                  ((long)&generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                          ::variableTypes[0].type + lVar1));
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)this);
      this_00 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x800);
      ResourceTestCase::ResourceTestCase(this_00,context,&variable,&local_38,(char *)0x0);
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_00);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
    }
  }
  return;
}

Assistant:

static void generateProgramInputOutputTypeBasicTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool allowMatrixCases, int expandLevel)
{
	static const struct
	{
		glu::DataType	type;
		bool			isMatrix;
		int				level;
	} variableTypes[] =
	{
		{ glu::TYPE_FLOAT,			false,		0	},
		{ glu::TYPE_INT,			false,		1	},
		{ glu::TYPE_UINT,			false,		1	},
		{ glu::TYPE_FLOAT_VEC2,		false,		2	},
		{ glu::TYPE_FLOAT_VEC3,		false,		1	},
		{ glu::TYPE_FLOAT_VEC4,		false,		2	},
		{ glu::TYPE_INT_VEC2,		false,		0	},
		{ glu::TYPE_INT_VEC3,		false,		2	},
		{ glu::TYPE_INT_VEC4,		false,		2	},
		{ glu::TYPE_UINT_VEC2,		false,		2	},
		{ glu::TYPE_UINT_VEC3,		false,		2	},
		{ glu::TYPE_UINT_VEC4,		false,		0	},
		{ glu::TYPE_FLOAT_MAT2,		true,		2	},
		{ glu::TYPE_FLOAT_MAT2X3,	true,		2	},
		{ glu::TYPE_FLOAT_MAT2X4,	true,		2	},
		{ glu::TYPE_FLOAT_MAT3X2,	true,		0	},
		{ glu::TYPE_FLOAT_MAT3,		true,		2	},
		{ glu::TYPE_FLOAT_MAT3X4,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4X2,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4X3,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4,		true,		2	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(variableTypes); ++ndx)
	{
		if (!allowMatrixCases && variableTypes[ndx].isMatrix)
			continue;

		if (variableTypes[ndx].level <= expandLevel)
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, variableTypes[ndx].type));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, PROGRAMRESOURCEPROP_TYPE)));
		}
	}
}